

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextbrowser.cpp
# Opt level: O3

void QTextBrowser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  Data *pDVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  code *UNRECOVERED_JUMPTABLE_00;
  int iVar8;
  QArrayDataPointer<QString> *other;
  long in_FS_OFFSET;
  int *piVar9;
  QArrayDataPointer<QString> local_58;
  undefined1 local_38 [16];
  qsizetype local_28;
  QWidgetData *local_18;
  
  local_18 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_58.d = (Data *)CONCAT71(local_58.d._1_7_,*_a[1]);
      iVar8 = 0;
      local_38._8_8_ = &local_58;
      break;
    case 1:
      local_58.d = (Data *)CONCAT71(local_58.d._1_7_,*_a[1]);
      iVar8 = 1;
      local_38._8_8_ = &local_58;
      break;
    case 2:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QMetaObject::activate(_o,&staticMetaObject,2,(void **)0x0);
        return;
      }
      goto LAB_004a8567;
    case 3:
      iVar8 = 3;
      local_38._8_8_ = (QString *)_a[1];
      break;
    case 4:
      iVar8 = 4;
      local_38._8_8_ = (QString *)_a[1];
      break;
    case 5:
      iVar8 = 5;
      local_38._8_8_ = (QString *)_a[1];
      break;
    case 6:
      other = (QArrayDataPointer<QString> *)_a[1];
      uVar7 = *_a[2];
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x210);
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_18) goto LAB_004a8567;
      goto LAB_004a8493;
    case 7:
      other = (QArrayDataPointer<QString> *)_a[1];
switchD_004a81a2_caseD_0:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x210);
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        uVar7 = 0;
LAB_004a8493:
        (*UNRECOVERED_JUMPTABLE_00)(_o,other,uVar7,UNRECOVERED_JUMPTABLE_00);
        return;
      }
      goto LAB_004a8567;
    case 8:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x1f0);
      goto LAB_004a84b2;
    case 9:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x1f8);
      goto LAB_004a84b2;
    case 10:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x200);
      goto LAB_004a84b2;
    case 0xb:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x208);
LAB_004a84b2:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        (*UNRECOVERED_JUMPTABLE_00)
                  (_o,&switchD_004a8157::switchdataD_006e0da0,*(QWidgetData **)(in_FS_OFFSET + 0x28)
                   ,UNRECOVERED_JUMPTABLE_00);
        return;
      }
      goto LAB_004a8567;
    default:
      goto switchD_004a813b_caseD_3;
    }
    local_38._0_8_ = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar8,(void **)local_38);
    break;
  case ReadProperty:
    if (4 < (uint)_id) break;
    puVar1 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      source((QTextBrowser *)local_38);
      pDVar2 = (Data *)*puVar1;
      *puVar1 = local_38._0_8_;
      local_38._0_8_ = pDVar2;
      QUrl::~QUrl((QUrl *)local_38);
      break;
    case 1:
      lVar3 = *(long *)(*(long *)(_o + 8) + 0x3d8);
      if (lVar3 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 0x3d0) + -8 + lVar3 * 0x38);
      }
      *(undefined4 *)puVar1 = uVar7;
      break;
    case 2:
      lVar3 = *(long *)(_o + 8);
      piVar9 = *(int **)(lVar3 + 0x408);
      uVar4 = *(undefined8 *)(lVar3 + 0x410);
      uVar5 = *(undefined8 *)(lVar3 + 0x418);
      if (piVar9 == (int *)0x0) {
        piVar9 = (int *)0x0;
      }
      else {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      local_58.d = (Data *)0x0;
      local_58.ptr = (QString *)0x0;
      local_58.size = 0;
      local_38._0_8_ = *puVar1;
      local_38._8_8_ = puVar1[1];
      *puVar1 = piVar9;
      puVar1[1] = uVar4;
      local_28 = puVar1[2];
      puVar1[2] = uVar5;
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_38);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      break;
    case 3:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x422);
      goto LAB_004a82f6;
    case 4:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x423);
LAB_004a82f6:
      *(undefined1 *)puVar1 = uVar6;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      other = (QArrayDataPointer<QString> *)*_a;
      switch(_id) {
      case 0:
        goto switchD_004a81a2_caseD_0;
      case 2:
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          QArrayDataPointer<QString>::operator=
                    ((QArrayDataPointer<QString> *)(*(long *)(_o + 8) + 0x408),other);
          return;
        }
        goto LAB_004a8567;
      case 3:
        *(undefined1 *)(*(long *)(_o + 8) + 0x422) = *(undefined1 *)&other->d;
        break;
      case 4:
        *(undefined1 *)(*(long *)(_o + 8) + 0x423) = *(undefined1 *)&other->d;
      }
    }
    break;
  case IndexOfMethod:
    UNRECOVERED_JUMPTABLE_00 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (UNRECOVERED_JUMPTABLE_00 == backwardAvailable && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (UNRECOVERED_JUMPTABLE_00 == forwardAvailable && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (UNRECOVERED_JUMPTABLE_00 == historyChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (UNRECOVERED_JUMPTABLE_00 == sourceChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (UNRECOVERED_JUMPTABLE_00 == highlighted && lVar3 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (UNRECOVERED_JUMPTABLE_00 == anchorClicked && lVar3 == 0) {
      *(undefined4 *)*_a = 5;
    }
  }
switchD_004a813b_caseD_3:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_004a8567:
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextBrowser *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->backwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->forwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->historyChanged(); break;
        case 3: _t->sourceChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 4: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 5: _t->anchorClicked((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 6: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTextDocument::ResourceType>>(_a[2]))); break;
        case 7: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 8: _t->backward(); break;
        case 9: _t->forward(); break;
        case 10: _t->home(); break;
        case 11: _t->reload(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::backwardAvailable, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::forwardAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)()>(_a, &QTextBrowser::historyChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::sourceChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::highlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::anchorClicked, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QUrl*>(_v) = _t->source(); break;
        case 1: *reinterpret_cast<QTextDocument::ResourceType*>(_v) = _t->sourceType(); break;
        case 2: *reinterpret_cast<QStringList*>(_v) = _t->searchPaths(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->openLinks(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSource(*reinterpret_cast<QUrl*>(_v)); break;
        case 2: _t->setSearchPaths(*reinterpret_cast<QStringList*>(_v)); break;
        case 3: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setOpenLinks(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}